

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

uint __thiscall glslang::TType::getBufferReferenceAlignment(TType *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TQualifier *this_00;
  undefined4 extraout_var_00;
  long lVar3;
  uint local_24;
  TType *this_local;
  
  iVar2 = (*this->_vptr_TType[7])();
  if (iVar2 == 0x12) {
    iVar2 = (*this->_vptr_TType[0x15])();
    this_00 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x50))();
    bVar1 = TQualifier::hasBufferReferenceAlign(this_00);
    if (bVar1) {
      iVar2 = (*this->_vptr_TType[0x15])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))();
      local_24 = 1 << ((byte)(uint)((ulong)*(undefined8 *)(lVar3 + 0x24) >> 0x33) & 0x1f);
    }
    else {
      local_24 = 0x10;
    }
    this_local._4_4_ = local_24;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int getBufferReferenceAlignment() const
    {
        if (getBasicType() == glslang::EbtReference) {
            return getReferentType()->getQualifier().hasBufferReferenceAlign() ?
                        (1u << getReferentType()->getQualifier().layoutBufferReferenceAlign) : 16u;
        }
        return 0;
    }